

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>::
do_run_mode(jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>
            *this,int32_t start_index,decoder_strategy *param_2)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  pixel_type *ppVar5;
  pixel_type *ppVar6;
  triplet<unsigned_char> tVar7;
  int32_t iVar8;
  int iVar9;
  triplet<unsigned_char> rb;
  uint uVar10;
  
  ppVar5 = this->current_line_;
  uVar1 = ppVar5[(long)start_index + -1].field_0;
  uVar3 = ppVar5[(long)start_index + -1].field_1;
  tVar7.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar3;
  tVar7.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar1;
  tVar7.field_2.v3 = ppVar5[(long)start_index + -1].field_2.v3;
  iVar8 = decode_run_pixels(this,tVar7,ppVar5 + start_index,this->width_ - start_index);
  uVar10 = start_index + iVar8;
  if (uVar10 != this->width_) {
    ppVar5 = this->previous_line_ + uVar10;
    uVar2 = ppVar5->field_0;
    uVar4 = ppVar5->field_1;
    rb.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar4;
    rb.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar2;
    rb.field_2.v3 = this->previous_line_[uVar10].field_2.v3;
    tVar7 = decode_run_interruption_pixel(this,tVar7,rb);
    ppVar6 = this->current_line_;
    ppVar5 = ppVar6 + uVar10;
    ppVar5->field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(char)tVar7._0_2_;
    ppVar5->field_1 =
         (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)(char)((ushort)tVar7._0_2_ >> 8);
    ppVar6[uVar10].field_2.v3 = (uchar)tVar7.field_2;
    iVar9 = 1;
    if (1 < this->run_index_) {
      iVar9 = this->run_index_;
    }
    this->run_index_ = iVar9 + -1;
    iVar8 = iVar8 + 1;
  }
  return iVar8;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }